

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

HeapArgumentsObject *
Js::JavascriptOperators::CreateHeapArguments
          (JavascriptFunction *funcCallee,uint32 actualsCount,uint32 formalsCount,Var frameObj,
          ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  ScriptContext *requestContext;
  bool bVar3;
  BOOL BVar4;
  HeapArgumentsObject *this;
  DynamicTypeHandler *pDVar5;
  uint64 uVar6;
  uint64 uVar7;
  JavascriptFunction *pJVar8;
  undefined4 *puVar9;
  Var newValue;
  PropertyValueInfo local_98;
  ScriptContext *local_58;
  DynamicTypeHandler *local_50;
  JavascriptFunction *local_48;
  JavascriptLibrary *local_40;
  double local_38;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  local_58 = scriptContext;
  BVar4 = JavascriptFunction::IsStrictMode(funcCallee);
  local_40 = pJVar1;
  this = JavascriptLibrary::CreateHeapArguments(pJVar1,frameObj,formalsCount,BVar4 != 0);
  pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  HeapArgumentsObject::SetNumberOfArguments(this,actualsCount);
  local_50 = pDVar5;
  local_48 = funcCallee;
  if ((int)actualsCount < 0) {
    local_38 = (double)actualsCount;
    uVar6 = NumberUtilities::ToSpecial(local_38);
    bVar3 = NumberUtilities::IsNan(local_38);
    if (bVar3) {
      uVar7 = NumberUtilities::ToSpecial(local_38);
      if (uVar7 != 0xfff8000000000000) {
        uVar7 = NumberUtilities::ToSpecial(local_38);
        if (uVar7 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar9 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) goto LAB_00ab9b58;
          *puVar9 = 0;
        }
      }
    }
    newValue = (Var)(uVar6 ^ 0xfffc000000000000);
  }
  else {
    newValue = (Var)((ulong)actualsCount | 0x1000000000000);
  }
  requestContext = local_58;
  local_98.m_instance = (RecyclableObject *)0x0;
  local_98.m_propertyIndex = 0xffff;
  local_98.m_attributes = '\0';
  local_98.flags = InlineCacheNoFlags;
  local_98.cacheInfoFlag = defaultInfoFlags;
  local_98.inlineCache = (InlineCache *)0x0;
  local_98.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  local_98.functionBody = (FunctionBody *)0x0;
  local_98.prop = (RecyclableObject *)0x0;
  local_98.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  local_98.inlineCacheIndex = 0xffffffff;
  local_98.allowResizingPolymorphicInlineCache = true;
  SetProperty_Internal<false>
            (this,(RecyclableObject *)this,false,0xd1,newValue,&local_98,local_58,
             PropertyOperation_None);
  pJVar1 = local_40;
  pJVar8 = JavascriptLibrary::EnsureArrayPrototypeValuesFunction(local_40);
  local_98.m_instance = (RecyclableObject *)0x0;
  local_98.m_propertyIndex = 0xffff;
  local_98.m_attributes = '\0';
  local_98.flags = InlineCacheNoFlags;
  local_98.cacheInfoFlag = defaultInfoFlags;
  local_98.inlineCache = (InlineCache *)0x0;
  local_98.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  local_98.functionBody = (FunctionBody *)0x0;
  local_98.prop = (RecyclableObject *)0x0;
  local_98.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  local_98.inlineCacheIndex = 0xffffffff;
  local_98.allowResizingPolymorphicInlineCache = true;
  SetProperty_Internal<false>
            (this,(RecyclableObject *)this,false,0x14,pJVar8,&local_98,requestContext,
             PropertyOperation_None);
  pJVar8 = local_48;
  BVar4 = JavascriptFunction::IsStrictMode(local_48);
  if (BVar4 == 0) {
    pJVar8 = StackScriptFunction::EnsureBoxed(pJVar8,(void *)0x0,L"callee");
    local_98.m_instance = (RecyclableObject *)0x0;
    local_98.m_propertyIndex = 0xffff;
    local_98.m_attributes = '\0';
    local_98.flags = InlineCacheNoFlags;
    local_98.cacheInfoFlag = defaultInfoFlags;
    local_98.inlineCache = (InlineCache *)0x0;
    local_98.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    local_98.functionBody = (FunctionBody *)0x0;
    local_98.prop = (RecyclableObject *)0x0;
    local_98.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
    local_98.inlineCacheIndex = 0xffffffff;
    local_98.allowResizingPolymorphicInlineCache = true;
    SetProperty_Internal<false>
              (this,(RecyclableObject *)this,false,0x1ce,pJVar8,&local_98,requestContext,
               PropertyOperation_None);
  }
  else {
    pJVar8 = (pJVar1->super_JavascriptLibraryBase).throwTypeErrorRestrictedPropertyAccessorFunction.
             ptr;
    (*(this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
              (this,0x1ce,pJVar8,pJVar8,0x40);
  }
  pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  if (pDVar5 != local_50) {
    bVar3 = ScriptContext::IsScriptContextInDebugMode(requestContext);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1daa,
                                  "(argsObj->GetTypeHandler() == typeHandler || scriptContext->IsScriptContextInDebugMode())"
                                  ,
                                  "type handler should not transition because we initialized it correctly"
                                 );
      if (!bVar3) {
LAB_00ab9b58:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
  }
  return this;
}

Assistant:

HeapArgumentsObject *JavascriptOperators::CreateHeapArguments(JavascriptFunction *funcCallee, uint32 actualsCount, uint32 formalsCount, Var frameObj, ScriptContext* scriptContext)
    {
        JavascriptLibrary *library = scriptContext->GetLibrary();
        HeapArgumentsObject *argsObj = library->CreateHeapArguments(frameObj, formalsCount, !!funcCallee->IsStrictMode());

#if DBG
        DynamicTypeHandler* typeHandler = argsObj->GetTypeHandler();
#endif

        //
        // Set the number of arguments of Arguments Object
        //
        argsObj->SetNumberOfArguments(actualsCount);

        JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::length, JavascriptNumber::ToVar(actualsCount, scriptContext), scriptContext);
        JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::_symbolIterator, library->EnsureArrayPrototypeValuesFunction(), scriptContext);
        if (funcCallee->IsStrictMode())
        {
            JavascriptFunction* restrictedPropertyAccessor = library->GetThrowTypeErrorRestrictedPropertyAccessorFunction();
            argsObj->SetAccessors(PropertyIds::callee, restrictedPropertyAccessor, restrictedPropertyAccessor, PropertyOperation_NonFixedValue);

        }
        else
        {
            JavascriptOperators::SetProperty(argsObj, argsObj, PropertyIds::callee,
                StackScriptFunction::EnsureBoxed(BOX_PARAM(funcCallee, nullptr, _u("callee"))), scriptContext);
        }

        AssertMsg(argsObj->GetTypeHandler() == typeHandler || scriptContext->IsScriptContextInDebugMode(), "type handler should not transition because we initialized it correctly");

        return argsObj;
    }